

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error adios2_variable_count(size_t *count,adios2_variable *variable)

{
  Dims countCpp;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,"for const adios2_variable, in call to adios2_variable_count",
             (allocator *)&local_78);
  adios2::helper::CheckForNullptr<adios2_variable_const>(variable,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string
            ((string *)&local_50,"for const adios2_count, in call to adios2_variable_count",
             (allocator *)&local_78);
  adios2::helper::CheckForNullptr<unsigned_long>(count,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  switch(*(undefined4 *)(variable + 0x28)) {
  case 1:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<signed_char>::typeinfo,0);
    adios2::core::Variable<signed_char>::Count();
    break;
  case 2:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<short>::typeinfo,0);
    adios2::core::Variable<short>::Count();
    break;
  case 3:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<int>::typeinfo,0);
    adios2::core::Variable<int>::Count();
    break;
  case 4:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<long>::typeinfo,0);
    adios2::core::Variable<long>::Count();
    break;
  case 5:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<unsigned_char>::typeinfo,0);
    adios2::core::Variable<unsigned_char>::Count();
    break;
  case 6:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<unsigned_short>::typeinfo,0);
    adios2::core::Variable<unsigned_short>::Count();
    break;
  case 7:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<unsigned_int>::typeinfo,0);
    adios2::core::Variable<unsigned_int>::Count();
    break;
  case 8:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<unsigned_long>::typeinfo,0);
    adios2::core::Variable<unsigned_long>::Count();
    break;
  case 9:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<float>::typeinfo,0);
    adios2::core::Variable<float>::Count();
    break;
  case 10:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<double>::typeinfo,0);
    adios2::core::Variable<double>::Count();
    break;
  case 0xb:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<long_double>::typeinfo,0);
    adios2::core::Variable<long_double>::Count();
    break;
  case 0xc:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<std::complex<float>>::typeinfo,0);
    adios2::core::Variable<std::complex<float>>::Count();
    break;
  case 0xd:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<std::complex<double>>::typeinfo,0);
    adios2::core::Variable<std::complex<double>>::Count();
    break;
  case 0xe:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
    adios2::core::Variable<std::__cxx11::string>::Count();
    break;
  case 0xf:
    __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                   &adios2::core::Variable<char>::typeinfo,0);
    adios2::core::Variable<char>::Count();
    break;
  default:
    goto switchD_0012564f_default;
  }
  if ((long)local_78._M_impl.super__Vector_impl_data._M_finish -
      (long)local_78._M_impl.super__Vector_impl_data._M_start != 0) {
    memmove(count,local_78._M_impl.super__Vector_impl_data._M_start,
            (long)local_78._M_impl.super__Vector_impl_data._M_finish -
            (long)local_78._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
switchD_0012564f_default:
  return adios2_error_none;
}

Assistant:

adios2_error adios2_variable_count(size_t *count, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for const adios2_variable, in call to "
                                                  "adios2_variable_count");
        adios2::helper::CheckForNullptr(count, "for const adios2_count, in call to "
                                               "adios2_variable_count");

        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        const adios2::DataType typeCpp = variableBase->m_Type;
        if (typeCpp == adios2::DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (typeCpp == adios2::helper::GetDataType<T>())                                          \
    {                                                                                              \
        const adios2::core::Variable<T> *variable =                                                \
            dynamic_cast<const adios2::core::Variable<T> *>(variableBase);                         \
        const adios2::Dims countCpp = variable->Count();                                           \
        std::copy(countCpp.begin(), countCpp.end(), count);                                        \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_variable_count"));
    }
}